

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive.h
# Opt level: O1

object_t * __thiscall
acto::intrusive::queue<acto::core::object_t,_acto::intrusive::spin_lock>::pop
          (queue<acto::core::object_t,_acto::intrusive::spin_lock> *this)

{
  spin_lock *this_00;
  object_t *poVar1;
  undefined1 auVar2 [16];
  char cVar3;
  object_t *poVar4;
  
  this_00 = &this->mutex_;
  LOCK();
  cVar3 = (this->mutex_).flag_.super___atomic_flag_base._M_i;
  (this->mutex_).flag_.super___atomic_flag_base._M_i = true;
  UNLOCK();
  while (cVar3 != '\0') {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this_00;
    std::
    __atomic_wait_address_v<bool,std::atomic_flag::wait(bool,std::memory_order)const::_lambda()_1_>
              ((bool *)this_00,true,(anon_class_16_2_20c11228_for___vfn)(auVar2 << 0x40));
    LOCK();
    cVar3 = (this_00->flag_).super___atomic_flag_base._M_i;
    (this_00->flag_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  }
  poVar1 = this->tail_;
  if (poVar1 == (object_t *)0x0) {
    poVar4 = (object_t *)0x0;
  }
  else {
    poVar4 = (poVar1->super_node<acto::core::object_t>).next;
    if (poVar4 == poVar1) {
      this->tail_ = (object_t *)0x0;
    }
    else {
      (poVar1->super_node<acto::core::object_t>).next =
           (poVar4->super_node<acto::core::object_t>).next;
    }
    (poVar4->super_node<acto::core::object_t>).next = (object_t *)0x0;
  }
  spin_lock::unlock(this_00);
  return poVar4;
}

Assistant:

T* pop() {
    std::lock_guard g(mutex_);

    if (tail_) {
      T* result = tail_->next;

      if (result == tail_)
        tail_ = nullptr;
      else
        tail_->next = tail_->next->next;

      result->next = nullptr;
      return result;
    }
    return nullptr;
  }